

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpptrace.cpp
# Opt level: O0

char * __thiscall cpptrace::lazy_exception::what(lazy_exception *this)

{
  bool bVar1;
  stacktrace *this_00;
  char *pcVar2;
  string local_98;
  allocator<char> local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  lazy_exception *local_10;
  lazy_exception *this_local;
  
  local_10 = this;
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (&this->what_string);
  if (bVar1) {
    pcVar2 = (char *)(**(code **)((long)this->super_exception + 0x18))();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,":\n",&local_71);
    std::operator+(&local_50,pcVar2,&local_70);
    this_00 = cpptrace::detail::lazy_trace_holder::get_resolved_trace(&this->trace_holder);
    stacktrace::to_string_abi_cxx11_(&local_98,this_00,false);
    std::operator+(&local_30,&local_50,&local_98);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&this->what_string,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
  }
  pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (&this->what_string);
  return pcVar2;
}

Assistant:

const char* lazy_exception::what() const noexcept {
        if(what_string.empty()) {
            what_string = message() + std::string(":\n") + trace_holder.get_resolved_trace().to_string();
        }
        return what_string.c_str();
    }